

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive1_test.cc
# Opt level: O0

void re2::RepetitionSimple(void)

{
  StringPiece *in_RCX;
  StringPiece *s;
  StringPiece *s_00;
  StringPiece *s_01;
  StringPiece *s_02;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  StringPiece local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  StringPiece local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  StringPiece local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  StringPiece local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  StringPiece local_40;
  StringPiece local_30;
  undefined1 local_20 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ops;
  
  StringPiece::StringPiece(&local_30," ");
  StringPiece::StringPiece
            (&local_40,
             "%s{0} %s{0,} %s{1} %s{1,} %s{0,1} %s{0,2} %s{1,2} %s{2} %s{2,} %s{3,4} %s{4,5} %s* %s+ %s? %s*? %s+? %s??"
            );
  Split_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_20,(re2 *)&local_30,&local_40,in_RCX);
  StringPiece::StringPiece(&local_68,"abc.");
  Explode_abi_cxx11_(&local_58,(re2 *)&local_68,s);
  StringPiece::StringPiece(&local_a0,"ab");
  Explode_abi_cxx11_(&local_90,(re2 *)&local_a0,s_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"(?:%s)",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"",&local_e9);
  ExhaustiveTest(3,2,&local_58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_20,6,&local_90,(string *)local_c0,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  StringPiece::StringPiece(&local_118,"abc.");
  Explode_abi_cxx11_(&local_108,(re2 *)&local_118,s_01);
  StringPiece::StringPiece(&local_140,"a");
  Explode_abi_cxx11_(&local_130,(re2 *)&local_140,s_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"(?:%s)",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"",&local_189);
  ExhaustiveTest(3,2,&local_108,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_20,0x28,&local_130,(string *)local_160,(string *)local_188);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_20);
  return;
}

Assistant:

TEST(Repetition, Simple) {
  vector<string> ops = Split(" ",
    "%s{0} %s{0,} %s{1} %s{1,} %s{0,1} %s{0,2} "
    "%s{1,2} %s{2} %s{2,} %s{3,4} %s{4,5} "
    "%s* %s+ %s? %s*? %s+? %s??");
  ExhaustiveTest(3, 2, Explode("abc."), ops,
                 6, Explode("ab"), "(?:%s)", "");
  ExhaustiveTest(3, 2, Explode("abc."), ops,
                 40, Explode("a"), "(?:%s)", "");
}